

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall JetHead::vector<JetHead::Path>::sizeup(vector<JetHead::Path> *this,uint newSize)

{
  long lVar1;
  long *plVar2;
  string *psVar3;
  long *plVar4;
  ulong uVar5;
  Path *pPVar6;
  ulong uVar7;
  long lVar8;
  string *psVar9;
  
  uVar7 = 0x20;
  if (this->mAllocated != 0) {
    uVar7 = (ulong)(this->mAllocated * 2);
  }
  if (newSize != 0) {
    uVar7 = (ulong)newSize;
  }
  psVar3 = (string *)operator_new__(uVar7 << 5);
  pPVar6 = this->mData;
  if (pPVar6 != (Path *)0x0) {
    if (this->mSize != 0) {
      lVar8 = 0x10;
      uVar5 = 0;
      psVar9 = psVar3;
      do {
        pPVar6 = this->mData;
        *(string **)psVar9 = psVar9 + 0x10;
        lVar1 = *(long *)((long)pPVar6 + lVar8 + -0x10);
        std::__cxx11::string::_M_construct<char*>
                  (psVar9,lVar1,*(long *)((long)pPVar6 + lVar8 + -8) + lVar1);
        plVar2 = *(long **)((long)this->mData + lVar8 + -0x10);
        plVar4 = (long *)((long)&(this->mData->mPath)._M_dataplus._M_p + lVar8);
        if (plVar4 != plVar2) {
          operator_delete(plVar2,*plVar4 + 1);
        }
        uVar5 = uVar5 + 1;
        psVar9 = psVar9 + 0x20;
        lVar8 = lVar8 + 0x20;
      } while (uVar5 < this->mSize);
      pPVar6 = this->mData;
      if (pPVar6 == (Path *)0x0) goto LAB_00117df9;
    }
    operator_delete__(pPVar6);
  }
LAB_00117df9:
  this->mData = (Path *)psVar3;
  this->mAllocated = (uint)uVar7;
  return;
}

Assistant:

void sizeup(unsigned newSize=0)
		{
			// No size was specified, double the existing size.
			// Doubling a self-expanding array means that storing O(n) 
			// elements takes O(n lg n) worst case.  Adding only a 
			// constant number of elements makes that O(n^2).
			if (newSize == 0) 
			{
				// If we allocated ANYTHING yet, then double it, if 
				// not just use the default size.
				if (mAllocated)
				{
					newSize = mAllocated * 2;
				} else {
					newSize = DEFAULT_ALLOCATION;
				}
			}

			// A new buffer
			T* temp = (T*)(new uint8_t[sizeof(T) * newSize]);

			// If we had data, copy it over
			if (mData)
			{
				// Move all of my data into the new buffer (copy then delete)
				for (unsigned i = 0; i < mSize; i++)
				{
					new(temp + i) T(mData[i]);
					mData[i].~T();
				}
				
				// Delete old buffer
				delete[] (uint8_t*)mData;
			}
			
			// Keep new buffer
			mData = temp;

			// Remember new allocation size
			mAllocated = newSize;
		}